

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatVariadic.cpp
# Opt level: O0

pair<llvm::ReplacementItem,_llvm::StringRef> * __thiscall
llvm::formatv_object_base::splitLiteralAndReplacement
          (pair<llvm::ReplacementItem,_llvm::StringRef> *__return_storage_ptr__,
          formatv_object_base *this,StringRef Fmt)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  ReplacementItem *__x;
  StringRef Spec_00;
  StringRef SVar4;
  StringRef local_280;
  size_t local_270;
  char *local_268;
  ReplacementItem local_260;
  size_t local_220;
  char *local_218;
  undefined1 local_210 [8];
  Optional<llvm::ReplacementItem> RI;
  StringRef Right;
  StringRef Spec;
  ReplacementItem local_188;
  size_t local_148;
  size_t BO2;
  size_t BC;
  char *local_130;
  ReplacementItem local_128;
  undefined1 local_e8 [8];
  StringRef Right_1;
  StringRef Middle;
  size_t NumEscapedBraces;
  function_ref<bool_(char)> local_b8;
  StringRef local_a8;
  undefined1 local_98 [8];
  StringRef Braces;
  ReplacementItem local_68;
  size_t local_28;
  size_t BO;
  size_t From;
  StringRef Fmt_local;
  
  Fmt_local.Data = Fmt.Data;
  BO = 0;
  From = (size_t)this;
  while( true ) {
    sVar3 = BO;
    sVar2 = StringRef::size((StringRef *)&From);
    if (sVar2 <= sVar3 || BO == 0xffffffffffffffff) {
      local_270 = From;
      local_268 = Fmt_local.Data;
      SVar4.Length = (size_t)Fmt_local.Data;
      SVar4.Data = (char *)From;
      ReplacementItem::ReplacementItem(&local_260,SVar4);
      memset(&local_280,0,0x10);
      StringRef::StringRef(&local_280);
      std::make_pair<llvm::ReplacementItem,llvm::StringRef>
                (__return_storage_ptr__,&local_260,&local_280);
      return __return_storage_ptr__;
    }
    local_28 = StringRef::find_first_of((StringRef *)&From,'{',BO);
    if (local_28 != 0) {
      SVar4 = StringRef::substr((StringRef *)&From,0,local_28);
      ReplacementItem::ReplacementItem(&local_68,SVar4);
      join_0x00000010_0x00000000_ =
           StringRef::substr((StringRef *)&From,local_28,0xffffffffffffffff);
      std::make_pair<llvm::ReplacementItem,llvm::StringRef>
                (__return_storage_ptr__,&local_68,(StringRef *)&Braces.Length);
      return __return_storage_ptr__;
    }
    local_a8 = StringRef::drop_front((StringRef *)&From,0);
    function_ref<bool(char)>::
    function_ref<llvm::formatv_object_base::splitLiteralAndReplacement(llvm::StringRef)::__0>
              ((function_ref<bool(char)> *)&local_b8,
               (anon_class_1_0_00000001 *)((long)&NumEscapedBraces + 7),(type *)0x0);
    _local_98 = StringRef::take_while(&local_a8,local_b8);
    sVar2 = StringRef::size((StringRef *)local_98);
    if (1 < sVar2) {
      sVar3 = StringRef::size((StringRef *)local_98);
      join_0x00000010_0x00000000_ = StringRef::substr((StringRef *)&From,local_28,sVar3 >> 1);
      _local_e8 = StringRef::drop_front((StringRef *)&From,local_28 + (sVar3 >> 1) * 2);
      BC = Right_1.Length;
      local_130 = Middle.Data;
      ReplacementItem::ReplacementItem(&local_128,stack0xffffffffffffff28);
      std::make_pair<llvm::ReplacementItem,llvm::StringRef&>
                (__return_storage_ptr__,&local_128,(StringRef *)local_e8);
      return __return_storage_ptr__;
    }
    BO2 = StringRef::find_first_of((StringRef *)&From,'}',local_28);
    if (BO2 == 0xffffffffffffffff) break;
    local_148 = StringRef::find_first_of((StringRef *)&From,'{',local_28 + 1);
    if (local_148 < BO2) {
      SVar4 = StringRef::substr((StringRef *)&From,0,local_148);
      ReplacementItem::ReplacementItem(&local_188,SVar4);
      join_0x00000010_0x00000000_ =
           StringRef::substr((StringRef *)&From,local_148,0xffffffffffffffff);
      std::make_pair<llvm::ReplacementItem,llvm::StringRef>
                (__return_storage_ptr__,&local_188,(StringRef *)&Spec.Length);
      return __return_storage_ptr__;
    }
    SVar4 = StringRef::slice((StringRef *)&From,local_28 + 1,BO2);
    join_0x00000010_0x00000000_ = StringRef::substr((StringRef *)&From,BO2 + 1,0xffffffffffffffff);
    Right.Length = (size_t)SVar4.Data;
    local_220 = Right.Length;
    Spec.Data = (char *)SVar4.Length;
    local_218 = Spec.Data;
    Spec_00.Length = sVar3;
    Spec_00.Data = Spec.Data;
    parseReplacementItem
              ((Optional<llvm::ReplacementItem> *)local_210,(formatv_object_base *)Right.Length,
               Spec_00);
    bVar1 = Optional<llvm::ReplacementItem>::hasValue((Optional<llvm::ReplacementItem> *)local_210);
    if (bVar1) {
      __x = Optional<llvm::ReplacementItem>::operator*((Optional<llvm::ReplacementItem> *)local_210)
      ;
      std::make_pair<llvm::ReplacementItem&,llvm::StringRef&>
                (__return_storage_ptr__,__x,(StringRef *)&RI.Storage.hasVal);
      return __return_storage_ptr__;
    }
    BO = BO2 + 1;
  }
  __assert_fail("false && \"Unterminated brace sequence.  Escape with {{ for a literal brace.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/FormatVariadic.cpp"
                ,0x75,
                "static std::pair<ReplacementItem, StringRef> llvm::formatv_object_base::splitLiteralAndReplacement(StringRef)"
               );
}

Assistant:

std::pair<ReplacementItem, StringRef>
formatv_object_base::splitLiteralAndReplacement(StringRef Fmt) {
  std::size_t From = 0;
  while (From < Fmt.size() && From != StringRef::npos) {
    std::size_t BO = Fmt.find_first_of('{', From);
    // Everything up until the first brace is a literal.
    if (BO != 0)
      return std::make_pair(ReplacementItem{Fmt.substr(0, BO)}, Fmt.substr(BO));

    StringRef Braces =
        Fmt.drop_front(BO).take_while([](char C) { return C == '{'; });
    // If there is more than one brace, then some of them are escaped.  Treat
    // these as replacements.
    if (Braces.size() > 1) {
      size_t NumEscapedBraces = Braces.size() / 2;
      StringRef Middle = Fmt.substr(BO, NumEscapedBraces);
      StringRef Right = Fmt.drop_front(BO + NumEscapedBraces * 2);
      return std::make_pair(ReplacementItem{Middle}, Right);
    }
    // An unterminated open brace is undefined.  We treat the rest of the string
    // as a literal replacement, but we assert to indicate that this is
    // undefined and that we consider it an error.
    std::size_t BC = Fmt.find_first_of('}', BO);
    if (BC == StringRef::npos) {
      assert(
          false &&
          "Unterminated brace sequence.  Escape with {{ for a literal brace.");
      return std::make_pair(ReplacementItem{Fmt}, StringRef());
    }

    // Even if there is a closing brace, if there is another open brace before
    // this closing brace, treat this portion as literal, and try again with the
    // next one.
    std::size_t BO2 = Fmt.find_first_of('{', BO + 1);
    if (BO2 < BC)
      return std::make_pair(ReplacementItem{Fmt.substr(0, BO2)},
                            Fmt.substr(BO2));

    StringRef Spec = Fmt.slice(BO + 1, BC);
    StringRef Right = Fmt.substr(BC + 1);

    auto RI = parseReplacementItem(Spec);
    if (RI.hasValue())
      return std::make_pair(*RI, Right);

    // If there was an error parsing the replacement item, treat it as an
    // invalid replacement spec, and just continue.
    From = BC + 1;
  }
  return std::make_pair(ReplacementItem{Fmt}, StringRef());
}